

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

string<unsigned_long> * __thiscall
irr::core::string<unsigned_long>::operator=
          (string<unsigned_long> *this,string<unsigned_long> *other)

{
  undefined1 auVar1 [16];
  s32 sVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  int local_2c;
  unsigned_long *puStack_28;
  s32 i;
  unsigned_long *p;
  string<unsigned_long> *other_local;
  string<unsigned_long> *this_local;
  
  if (this != other) {
    if (this->array != (unsigned_long *)0x0) {
      operator_delete__(this->array);
    }
    sVar2 = size(other);
    this->used = sVar2 + 1;
    this->allocated = sVar2 + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->used;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    puVar4 = (unsigned_long *)operator_new__(uVar3);
    this->array = puVar4;
    puStack_28 = c_str(other);
    for (local_2c = 0; local_2c < this->used; local_2c = local_2c + 1) {
      this->array[local_2c] = *puStack_28;
      puStack_28 = puStack_28 + 1;
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const string<T>& other) 
	{
		if (this == &other)
			return *this;

		delete [] array;
		allocated = used = other.size()+1;
		array = new T[used];

		const T* p = other.c_str();
		for (s32 i=0; i<used; ++i, ++p)
			array[i] = *p;

		return *this;
	}